

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O2

GdlRuleItem * __thiscall GdlRule::InputItem(GdlRule *this,int n)

{
  pointer ppGVar1;
  GdlRuleItem *pGVar2;
  ulong uVar3;
  
  ppGVar1 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if ((ulong)((long)(this->m_vprit).
                      super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3) {
      return (GdlRuleItem *)0x0;
    }
    pGVar2 = ppGVar1[uVar3];
    uVar3 = uVar3 + 1;
  } while (pGVar2->m_nInputIndex != n);
  return pGVar2;
}

Assistant:

GdlRuleItem * GdlRule::InputItem(int n)
{
	for (size_t i = 0; i < m_vprit.size(); i++)
	{
		if (m_vprit[i]->m_nInputIndex == n)
			return m_vprit[i];
	}
	return NULL;
}